

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

_Bool ssh1_connection_filter_queue(ssh1_connection_state *s)

{
  Ssh *ssh;
  _Bool _Var1;
  unsigned_long uVar2;
  char *pcVar3;
  size_t sVar4;
  ptrlen pVar5;
  char *local_70;
  bool local_55;
  ssh1_channel *psStack_50;
  int bufsize;
  void *local_48;
  uint local_3c;
  _Bool expect_halfopen;
  ssh1_channel *psStack_38;
  uint localid;
  ssh1_channel *c;
  ptrlen data;
  PktIn *pktin;
  ssh1_connection_state *s_local;
  
  do {
    while( true ) {
      _Var1 = ssh1_common_filter_queue(&s->ppl);
      if (_Var1) {
        return true;
      }
      data.len = (size_t)(*((s->ppl).in_pq)->after)
                                   (&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,false);
      if ((PktIn *)data.len == (PktIn *)0x0) {
        return false;
      }
      if (4 < ((PktIn *)data.len)->type - 0x15U) break;
      uVar2 = BinarySource_get_uint32(((PktIn *)data.len)->binarysource_);
      local_3c = (uint)uVar2;
      psStack_38 = (ssh1_channel *)find234(s->channels,&local_3c,ssh1_channelfind);
      local_55 = true;
      if (*(int *)data.len != 0x15) {
        local_55 = *(int *)data.len == 0x16;
      }
      if ((psStack_38 == (ssh1_channel *)0x0) || ((bool)(psStack_38->halfopen & 1U) != local_55)) {
        ssh = (s->ppl).ssh;
        pcVar3 = ssh1_pkt_type(*(int *)data.len);
        if (psStack_38 == (ssh1_channel *)0x0) {
          local_70 = "nonexistent";
        }
        else {
          local_70 = "open";
          if ((psStack_38->halfopen & 1U) != 0) {
            local_70 = "half-open";
          }
        }
        ssh_remote_error(ssh,"Received %s for %s channel %u",pcVar3,local_70,(ulong)local_3c);
        return true;
      }
      switch(*(undefined4 *)data.len) {
      case 0x15:
        if ((psStack_38->halfopen & 1U) == 0) {
          __assert_fail("c->halfopen",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection1.c"
                        ,0x101,"_Bool ssh1_connection_filter_queue(struct ssh1_connection_state *)")
          ;
        }
        uVar2 = BinarySource_get_uint32((BinarySource *)(data.len + 0x30));
        psStack_38->remoteid = (uint)uVar2;
        psStack_38->halfopen = false;
        psStack_38->throttling_conn = false;
        chan_open_confirmation(psStack_38->chan);
        ssh1_channel_check_close(psStack_38);
        if ((psStack_38->pending_eof & 1U) != 0) {
          ssh1_channel_try_eof(psStack_38);
        }
        break;
      case 0x16:
        if ((psStack_38->halfopen & 1U) == 0) {
          __assert_fail("c->halfopen",
                        "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection1.c"
                        ,0x11e,"_Bool ssh1_connection_filter_queue(struct ssh1_connection_state *)")
          ;
        }
        chan_open_failed(psStack_38->chan,(char *)0x0);
        chan_free(psStack_38->chan);
        del234(s->channels,psStack_38);
        ssh1_channel_free(psStack_38);
        break;
      case 0x17:
        pVar5 = BinarySource_get_string((BinarySource *)(data.len + 0x30));
        psStack_50 = (ssh1_channel *)pVar5.ptr;
        c = psStack_50;
        local_48 = (void *)pVar5.len;
        data.ptr = local_48;
        if (*(int *)(data.len + 0x48) == 0) {
          sVar4 = chan_send(psStack_38->chan,false,psStack_50,(size_t)local_48);
          if (((psStack_38->throttling_conn & 1U) == 0) && (0x8000 < (int)sVar4)) {
            psStack_38->throttling_conn = true;
            ssh_throttle_conn((s->ppl).ssh,1);
          }
        }
        break;
      case 0x18:
        if ((psStack_38->closes & 4U) == 0) {
          psStack_38->closes = psStack_38->closes | 4;
          chan_send_eof(psStack_38->chan);
          ssh1_channel_check_close(psStack_38);
        }
        break;
      case 0x19:
        if ((psStack_38->closes & 8U) == 0) {
          if ((psStack_38->closes & 1U) == 0) {
            ssh_remote_error((s->ppl).ssh,
                             "Received CHANNEL_CLOSE_CONFIRMATION for channel %u for which we never sent CHANNEL_CLOSE\n"
                             ,(ulong)psStack_38->localid);
            return true;
          }
          psStack_38->closes = psStack_38->closes | 8;
          ssh1_channel_check_close(psStack_38);
        }
      }
      (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
    }
    _Var1 = ssh1_handle_direction_specific_packet(s,(PktIn *)data.len);
    if (!_Var1) {
      return false;
    }
    (*((s->ppl).in_pq)->after)(&((s->ppl).in_pq)->pqb,(PacketQueueNode *)(s->ppl).in_pq,true);
    _Var1 = ssh1_check_termination(s);
  } while (!_Var1);
  return true;
}

Assistant:

static bool ssh1_connection_filter_queue(struct ssh1_connection_state *s)
{
    PktIn *pktin;
    ptrlen data;
    struct ssh1_channel *c;
    unsigned localid;
    bool expect_halfopen;

    while (1) {
        if (ssh1_common_filter_queue(&s->ppl))
            return true;
        if ((pktin = pq_peek(s->ppl.in_pq)) == NULL)
            return false;

        switch (pktin->type) {
          case SSH1_MSG_CHANNEL_DATA:
          case SSH1_MSG_CHANNEL_OPEN_CONFIRMATION:
          case SSH1_MSG_CHANNEL_OPEN_FAILURE:
          case SSH1_MSG_CHANNEL_CLOSE:
          case SSH1_MSG_CHANNEL_CLOSE_CONFIRMATION:
            /*
             * Common preliminary code for all the messages from the
             * server that cite one of our channel ids: look up that
             * channel id, check it exists, and if it's for a sharing
             * downstream, pass it on.
             */
            localid = get_uint32(pktin);
            c = find234(s->channels, &localid, ssh1_channelfind);

            expect_halfopen = (
                pktin->type == SSH1_MSG_CHANNEL_OPEN_CONFIRMATION ||
                pktin->type == SSH1_MSG_CHANNEL_OPEN_FAILURE);

            if (!c || c->halfopen != expect_halfopen) {
                ssh_remote_error(
                    s->ppl.ssh, "Received %s for %s channel %u",
                    ssh1_pkt_type(pktin->type),
                    !c ? "nonexistent" : c->halfopen ? "half-open" : "open",
                    localid);
                return true;
            }

            switch (pktin->type) {
              case SSH1_MSG_CHANNEL_OPEN_CONFIRMATION:
                assert(c->halfopen);
                c->remoteid = get_uint32(pktin);
                c->halfopen = false;
                c->throttling_conn = false;

                chan_open_confirmation(c->chan);

                /*
                 * Now that the channel is fully open, it's possible
                 * in principle to immediately close it. Check whether
                 * it wants us to!
                 *
                 * This can occur if a local socket error occurred
                 * between us sending out CHANNEL_OPEN and receiving
                 * OPEN_CONFIRMATION. If that happens, all we can do
                 * is immediately initiate close proceedings now that
                 * we know the server's id to put in the close
                 * message. We'll have handled that in this code by
                 * having already turned c->chan into a zombie, so its
                 * want_close method (which ssh1_channel_check_close
                 * will consult) will already be returning true.
                 */
                ssh1_channel_check_close(c);

                if (c->pending_eof)
                    ssh1_channel_try_eof(c); /* in case we had a pending EOF */
                break;

              case SSH1_MSG_CHANNEL_OPEN_FAILURE:
                assert(c->halfopen);

                chan_open_failed(c->chan, NULL);
                chan_free(c->chan);

                del234(s->channels, c);
                ssh1_channel_free(c);
                break;

              case SSH1_MSG_CHANNEL_DATA:
                data = get_string(pktin);
                if (!get_err(pktin)) {
                    int bufsize = chan_send(
                        c->chan, false, data.ptr, data.len);

                    if (!c->throttling_conn && bufsize > SSH1_BUFFER_LIMIT) {
                        c->throttling_conn = true;
                        ssh_throttle_conn(s->ppl.ssh, +1);
                    }
                }
                break;

              case SSH1_MSG_CHANNEL_CLOSE:
                if (!(c->closes & CLOSES_RCVD_CLOSE)) {
                    c->closes |= CLOSES_RCVD_CLOSE;
                    chan_send_eof(c->chan);
                    ssh1_channel_check_close(c);
                }
                break;

              case SSH1_MSG_CHANNEL_CLOSE_CONFIRMATION:
                if (!(c->closes & CLOSES_RCVD_CLOSECONF)) {
                    if (!(c->closes & CLOSES_SENT_CLOSE)) {
                        ssh_remote_error(
                            s->ppl.ssh,
                            "Received CHANNEL_CLOSE_CONFIRMATION for channel"
                            " %u for which we never sent CHANNEL_CLOSE\n",
                            c->localid);
                        return true;
                    }

                    c->closes |= CLOSES_RCVD_CLOSECONF;
                    ssh1_channel_check_close(c);
                }
                break;
            }

            pq_pop(s->ppl.in_pq);
            break;

          default:
            if (ssh1_handle_direction_specific_packet(s, pktin)) {
                pq_pop(s->ppl.in_pq);
                if (ssh1_check_termination(s))
                    return true;
            } else {
                return false;
            }
        }
    }
}